

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEntryPointData.cpp
# Opt level: O2

void __thiscall
NativeEntryPointData::ClearTypeRefsAndGuards
          (NativeEntryPointData *this,ScriptContext *scriptContext)

{
  (this->runtimeTypeRefs).ptr = (WriteBarrierPtr<void> *)0x0;
  FreePropertyGuards(this);
  this->equivalentTypeCacheCount = 0;
  (this->equivalentTypeCaches).ptr = (EquivalentTypeCache *)0x0;
  UnregisterEquivalentTypeCaches(this,scriptContext);
  return;
}

Assistant:

void 
NativeEntryPointData::ClearTypeRefsAndGuards(ScriptContext * scriptContext)
{
    this->runtimeTypeRefs = nullptr;
    this->FreePropertyGuards();
    this->equivalentTypeCacheCount = 0;
    this->equivalentTypeCaches = nullptr;
    this->UnregisterEquivalentTypeCaches(scriptContext);
}